

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O0

bool __thiscall ftxui::SliderBase<int>::OnEvent(SliderBase<int> *this,Event *event)

{
  bool bVar1;
  int *piVar2;
  bool local_17a;
  bool local_169;
  Event local_140;
  byte local_f9;
  Event local_f8;
  byte local_b1;
  Event local_b0;
  Event local_60;
  Event *local_20;
  Event *event_local;
  SliderBase<int> *this_local;
  
  local_20 = event;
  event_local = (Event *)this;
  bVar1 = Event::is_mouse(event);
  if (bVar1) {
    Event::Event(&local_60,event);
    this_local._7_1_ = OnMouseEvent(this,&local_60);
    Event::~Event(&local_60);
  }
  else {
    bVar1 = Event::operator==(event,(Event *)Event::ArrowLeft);
    local_b1 = 0;
    local_169 = true;
    if (!bVar1) {
      Event::Character(&local_b0,'h');
      local_b1 = 1;
      local_169 = Event::operator==(event,&local_b0);
    }
    if ((local_b1 & 1) != 0) {
      Event::~Event(&local_b0);
    }
    if (local_169 == false) {
      bVar1 = Event::operator==(event,(Event *)Event::ArrowRight);
      local_f9 = 0;
      local_17a = true;
      if (!bVar1) {
        Event::Character(&local_f8,'l');
        local_f9 = 1;
        local_17a = Event::operator==(event,&local_f8);
      }
      if ((local_f9 & 1) != 0) {
        Event::~Event(&local_f8);
      }
      if (local_17a == false) {
        Event::Event(&local_140,event);
        this_local._7_1_ = ComponentBase::OnEvent(&this->super_ComponentBase,&local_140);
        Event::~Event(&local_140);
      }
      else {
        *this->value_ = this->increment_ + *this->value_;
        piVar2 = std::min<int>(this->value_,&this->max_);
        *this->value_ = *piVar2;
        this_local._7_1_ = 1;
      }
    }
    else {
      *this->value_ = *this->value_ - this->increment_;
      piVar2 = std::max<int>(this->value_,&this->min_);
      *this->value_ = *piVar2;
      this_local._7_1_ = 1;
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool OnEvent(Event event) final {
    if (event.is_mouse())
      return OnMouseEvent(event);

    if (event == Event::ArrowLeft || event == Event::Character('h')) {
      *value_ -= increment_;
      *value_ = std::max(*value_, min_);
      return true;
    }

    if (event == Event::ArrowRight || event == Event::Character('l')) {
      *value_ += increment_;
      *value_ = std::min(*value_, max_);
      return true;
    }

    return ComponentBase::OnEvent(event);
  }